

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3SrcListAssignCursors(Parse *pParse,SrcList *pList)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  
  if (pList != (SrcList *)0x0) {
    iVar2 = pList->nSrc;
    iVar3 = 0;
    for (piVar4 = &pList->a[0].iCursor; (iVar3 < iVar2 && (*piVar4 < 0)); piVar4 = piVar4 + 0x1c) {
      iVar1 = pParse->nTab;
      pParse->nTab = iVar1 + 1;
      *piVar4 = iVar1;
      if (*(Select **)(piVar4 + -6) != (Select *)0x0) {
        sqlite3SrcListAssignCursors(pParse,(*(Select **)(piVar4 + -6))->pSrc);
        iVar2 = pList->nSrc;
      }
      iVar3 = iVar3 + 1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListAssignCursors(Parse *pParse, SrcList *pList){
  int i;
  struct SrcList_item *pItem;
  assert(pList || pParse->db->mallocFailed );
  if( pList ){
    for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
      if( pItem->iCursor>=0 ) break;
      pItem->iCursor = pParse->nTab++;
      if( pItem->pSelect ){
        sqlite3SrcListAssignCursors(pParse, pItem->pSelect->pSrc);
      }
    }
  }
}